

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O1

int anon_unknown.dwarf_2f::AsyncRead(BIO *bio,char *out,int outl)

{
  uint uVar1;
  AsyncBio *pAVar2;
  BIO *b;
  int *piVar3;
  ulong uVar4;
  int len;
  
  pAVar2 = GetData(bio);
  b = BIO_next((BIO *)bio);
  uVar1 = 0;
  if (b != (BIO *)0x0 && pAVar2 != (AsyncBio *)0x0) {
    BIO_clear_retry_flags(bio);
    uVar4 = pAVar2->read_quota;
    if (uVar4 == 0) {
      BIO_set_retry_read(bio);
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      uVar1 = 0xffffffff;
    }
    else {
      len = (int)uVar4;
      if (pAVar2->datagram != false) {
        len = outl;
      }
      if ((ulong)(long)outl <= uVar4) {
        len = outl;
      }
      uVar1 = BIO_read(b,out,len);
      if ((int)uVar1 < 1) {
        BIO_copy_next_retry((BIO *)bio);
      }
      else {
        uVar4 = 1;
        if (pAVar2->datagram == false) {
          uVar4 = (ulong)uVar1;
        }
        pAVar2->read_quota = pAVar2->read_quota - uVar4;
      }
    }
  }
  return uVar1;
}

Assistant:

static int AsyncRead(BIO *bio, char *out, int outl) {
  AsyncBio *a = GetData(bio);
  BIO *next = BIO_next(bio);
  if (a == nullptr || next == nullptr) {
    return 0;
  }

  BIO_clear_retry_flags(bio);

  if (a->read_quota == 0) {
    BIO_set_retry_read(bio);
    errno = EAGAIN;
    return -1;
  }

  if (!a->datagram && static_cast<size_t>(outl) > a->read_quota) {
    outl = static_cast<int>(a->read_quota);
  }
  int ret = BIO_read(next, out, outl);
  if (ret <= 0) {
    BIO_copy_next_retry(bio);
  } else {
    a->read_quota -= (a->datagram ? 1 : ret);
  }
  return ret;
}